

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O1

int IDAGetCurrentYSens(void *ida_mem,N_Vector **yS)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x521,"IDAGetCurrentYSens",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *yS = *(N_Vector **)((long)ida_mem + 0x390);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetCurrentYSens(void* ida_mem, N_Vector** yS)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *yS = IDA_mem->ida_yyS;

  return (IDA_SUCCESS);
}